

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void jacobi_ek_compute(int n,double alpha,double beta,double *x,double *w)

{
  double *e;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar4 = exp2(alpha + beta + 1.0);
  dVar5 = r8_gamma(alpha + 1.0);
  dVar6 = r8_gamma(beta + 1.0);
  dVar7 = alpha + 2.0 + beta;
  dVar8 = r8_gamma(dVar7);
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (ulong)(uint)n << 3;
  }
  e = (double *)operator_new__(uVar2);
  *x = (beta - alpha) / dVar7;
  *e = ((alpha + 1.0) * 4.0 * (beta + 1.0)) / ((alpha + 3.0 + beta) * dVar7 * dVar7);
  lVar1 = 1;
  while (lVar1 < n) {
    dVar9 = (double)(int)(lVar1 + 1);
    dVar7 = dVar9 + dVar9 + alpha + beta;
    x[lVar1] = ((alpha + beta) * (beta - alpha)) / ((dVar7 + -2.0) * dVar7);
    e[lVar1] = ((dVar9 + alpha + beta) * (dVar9 + beta) * dVar9 * 4.0 * (dVar9 + alpha)) /
               ((dVar7 + 1.0) * (dVar7 + -1.0) * dVar7 * dVar7);
    lVar1 = lVar1 + 1;
  }
  uVar2 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar7 = e[uVar2];
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    e[uVar2] = dVar7;
  }
  dVar8 = (dVar4 * dVar5 * dVar6) / dVar8;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  *w = dVar8;
  for (lVar1 = 1; lVar1 < n; lVar1 = lVar1 + 1) {
    w[lVar1] = 0.0;
  }
  imtqlx(n,x,e,w);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    w[uVar2] = w[uVar2] * w[uVar2];
  }
  operator_delete__(e);
  return;
}

Assistant:

void jacobi_ek_compute ( int n, double alpha, double beta, double x[], 
  double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_EK_COMPUTE: Elhay-Kautsky method for Gauss-Jacobi quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) (1-X)**ALPHA * (1+X)**BETA * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double ALPHA, BETA, the exponents of (1-X) and
//    (1+X) in the quadrature rule.  For simple Gauss-Legendre quadrature,
//    set ALPHA = BETA = 0.0.  -1.0 < ALPHA and -1.0 < BETA are required.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double abi;
  double *bj;
  int i;
  double i_r8;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = pow ( 2.0, alpha + beta + 1.0 )
    * r8_gamma ( alpha + 1.0 ) 
    * r8_gamma ( beta + 1.0 ) 
    / r8_gamma ( 2.0 + alpha + beta );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  x[0] = ( beta - alpha ) / ( 2.0 + alpha + beta );

  bj[0] = 4.0 * ( 1.0 + alpha ) * ( 1.0 + beta ) 
    / ( ( 3.0 + alpha + beta ) 
      * ( 2.0 + alpha + beta ) * ( 2.0 + alpha + beta ) );

  for ( i = 1; i < n; i++ )
  {
    i_r8 = double( i + 1 );
    abi = 2.0 * i_r8 + alpha + beta;
    x[i] = ( beta + alpha ) * ( beta - alpha ) / ( ( abi - 2.0 ) * abi );
    bj[i] = 4.0 * i_r8 * ( i_r8 + alpha ) * ( i_r8 + beta ) 
      * ( i_r8 + alpha + beta ) 
      / ( ( abi - 1.0 ) * ( abi + 1.0 ) * abi * abi );
  }

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( bj[i] );
  }

  w[0] = sqrt ( zemu );

  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}